

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O1

maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void> *
__thiscall
pstore::command_line::
parser<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>::
operator()(maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
           *__return_storage_ptr__,
          parser<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
          *this,string *v)

{
  literal *plVar1;
  pointer pcVar2;
  bool bVar3;
  long lVar4;
  __normal_iterator<const_pstore::command_line::literal_*,_std::vector<pstore::command_line::literal,_std::allocator<pstore::command_line::literal>_>_>
  _Var5;
  __normal_iterator<const_pstore::command_line::literal_*,_std::vector<pstore::command_line::literal,_std::allocator<pstore::command_line::literal>_>_>
  __it;
  __normal_iterator<const_pstore::command_line::literal_*,_std::vector<pstore::command_line::literal,_std::allocator<pstore::command_line::literal>_>_>
  __it_00;
  string *local_38;
  
  __it._M_current =
       (this->super_parser_base).literals_.
       super__Vector_base<pstore::command_line::literal,_std::allocator<pstore::command_line::literal>_>
       ._M_impl.super__Vector_impl_data._M_start;
  plVar1 = (this->super_parser_base).literals_.
           super__Vector_base<pstore::command_line::literal,_std::allocator<pstore::command_line::literal>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if ((long)plVar1 - (long)__it._M_current == 0) goto LAB_0010ca9b;
  lVar4 = ((long)plVar1 - (long)__it._M_current >> 3) * -0x71c71c71c71c71c7 >> 2;
  __it_00._M_current = __it._M_current;
  local_38 = v;
  if (0 < lVar4) {
    __it_00._M_current = __it._M_current + lVar4 * 4;
    lVar4 = lVar4 + 1;
    do {
      bVar3 = __gnu_cxx::__ops::
              _Iter_pred<pstore::command_line::parser<std::__cxx11::string,void>::operator()(std::__cxx11::string_const&)const::$_0>
              ::operator()((_Iter_pred<pstore::command_line::parser<std::__cxx11::string,void>::operator()(std::__cxx11::string_const&)const::__0>
                            *)&local_38,__it);
      _Var5._M_current = __it._M_current;
      if (bVar3) goto LAB_0010ca96;
      bVar3 = __gnu_cxx::__ops::
              _Iter_pred<pstore::command_line::parser<std::__cxx11::string,void>::operator()(std::__cxx11::string_const&)const::$_0>
              ::operator()((_Iter_pred<pstore::command_line::parser<std::__cxx11::string,void>::operator()(std::__cxx11::string_const&)const::__0>
                            *)&local_38,__it._M_current + 1);
      _Var5._M_current = __it._M_current + 1;
      if (bVar3) goto LAB_0010ca96;
      bVar3 = __gnu_cxx::__ops::
              _Iter_pred<pstore::command_line::parser<std::__cxx11::string,void>::operator()(std::__cxx11::string_const&)const::$_0>
              ::operator()((_Iter_pred<pstore::command_line::parser<std::__cxx11::string,void>::operator()(std::__cxx11::string_const&)const::__0>
                            *)&local_38,__it._M_current + 2);
      _Var5._M_current = __it._M_current + 2;
      if (bVar3) goto LAB_0010ca96;
      bVar3 = __gnu_cxx::__ops::
              _Iter_pred<pstore::command_line::parser<std::__cxx11::string,void>::operator()(std::__cxx11::string_const&)const::$_0>
              ::operator()((_Iter_pred<pstore::command_line::parser<std::__cxx11::string,void>::operator()(std::__cxx11::string_const&)const::__0>
                            *)&local_38,__it._M_current + 3);
      _Var5._M_current = __it._M_current + 3;
      if (bVar3) goto LAB_0010ca96;
      __it._M_current = __it._M_current + 4;
      lVar4 = lVar4 + -1;
    } while (1 < lVar4);
  }
  lVar4 = ((long)plVar1 - (long)__it_00._M_current >> 3) * -0x71c71c71c71c71c7;
  if (lVar4 == 1) {
LAB_0010ca72:
    bVar3 = __gnu_cxx::__ops::
            _Iter_pred<pstore::command_line::parser<std::__cxx11::string,void>::operator()(std::__cxx11::string_const&)const::$_0>
            ::operator()((_Iter_pred<pstore::command_line::parser<std::__cxx11::string,void>::operator()(std::__cxx11::string_const&)const::__0>
                          *)&local_38,__it_00);
    _Var5._M_current = __it_00._M_current;
    if (!bVar3) {
      _Var5._M_current = plVar1;
    }
  }
  else if (lVar4 == 2) {
LAB_0010ca5d:
    bVar3 = __gnu_cxx::__ops::
            _Iter_pred<pstore::command_line::parser<std::__cxx11::string,void>::operator()(std::__cxx11::string_const&)const::$_0>
            ::operator()((_Iter_pred<pstore::command_line::parser<std::__cxx11::string,void>::operator()(std::__cxx11::string_const&)const::__0>
                          *)&local_38,__it_00);
    _Var5._M_current = __it_00._M_current;
    if (!bVar3) {
      __it_00._M_current = __it_00._M_current + 1;
      goto LAB_0010ca72;
    }
  }
  else {
    _Var5._M_current = plVar1;
    if ((lVar4 == 3) &&
       (bVar3 = __gnu_cxx::__ops::
                _Iter_pred<pstore::command_line::parser<std::__cxx11::string,void>::operator()(std::__cxx11::string_const&)const::$_0>
                ::operator()((_Iter_pred<pstore::command_line::parser<std::__cxx11::string,void>::operator()(std::__cxx11::string_const&)const::__0>
                              *)&local_38,__it_00), _Var5._M_current = __it_00._M_current, !bVar3))
    {
      __it_00._M_current = __it_00._M_current + 1;
      goto LAB_0010ca5d;
    }
  }
LAB_0010ca96:
  if (_Var5._M_current == plVar1) {
    *(undefined8 *)((long)&__return_storage_ptr__->storage_ + 8) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->storage_ + 0x10) = 0;
    *(undefined8 *)__return_storage_ptr__ = 0;
    (__return_storage_ptr__->storage_).__align = (anon_struct_8_0_00000001_for___align)0x0;
    *(undefined8 *)((long)&__return_storage_ptr__->storage_ + 0x18) = 0;
    return __return_storage_ptr__;
  }
LAB_0010ca9b:
  __return_storage_ptr__->valid_ = true;
  (__return_storage_ptr__->storage_).__align =
       (anon_struct_8_0_00000001_for___align)((long)&__return_storage_ptr__->storage_ + 0x10);
  pcVar2 = (v->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&__return_storage_ptr__->storage_,pcVar2,pcVar2 + v->_M_string_length);
  return __return_storage_ptr__;
}

Assistant:

maybe<std::string> parser<std::string>::operator() (std::string const & v) const {
                // If this one of the literal strings?
                auto const begin = this->begin ();
                auto const end = this->end ();
                if (std::distance (begin, end) != 0) {
                    auto const pos = std::find_if (
                        begin, end, [&v] (literal const & lit) { return v == lit.name; });
                    if (pos == end) {
                        return nothing<std::string> ();
                    }
                }
                return just (v);
            }